

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Molecules.cpp
# Opt level: O1

Molecule * __thiscall Molecules::Get(Molecules *this,KEY_ID s)

{
  ulong uVar1;
  Molecule *pMVar2;
  _Hash_node_base *p_Var3;
  ulong uVar4;
  __node_base_ptr p_Var5;
  __node_base_ptr p_Var6;
  
  uVar1 = (this->molecules)._M_h._M_bucket_count;
  uVar4 = s % uVar1;
  p_Var5 = (this->molecules)._M_h._M_buckets[uVar4];
  p_Var6 = (__node_base_ptr)0x0;
  if ((p_Var5 != (__node_base_ptr)0x0) &&
     (p_Var3 = p_Var5->_M_nxt, p_Var6 = p_Var5, p_Var5->_M_nxt[1]._M_nxt != (_Hash_node_base *)s)) {
    while (p_Var5 = p_Var3, p_Var3 = p_Var5->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
      p_Var6 = (__node_base_ptr)0x0;
      if (((ulong)p_Var3[1]._M_nxt % uVar1 != uVar4) ||
         (p_Var6 = p_Var5, p_Var3[1]._M_nxt == (_Hash_node_base *)s)) goto LAB_0013090c;
    }
    p_Var6 = (__node_base_ptr)0x0;
  }
LAB_0013090c:
  if (p_Var6 == (__node_base_ptr)0x0) {
    p_Var3 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var3 = p_Var6->_M_nxt;
  }
  pMVar2 = (Molecule *)(p_Var3 + 2);
  if (p_Var3 == (_Hash_node_base *)0x0) {
    pMVar2 = (Molecule *)0x0;
  }
  return pMVar2;
}

Assistant:

Molecule *Molecules::Get(KEY_ID s)
{
	unordered_map<KEY_ID, Molecule>::iterator i;
//	cerr << "molecules.size(): "<< molecules.size() << endl;
	i = molecules.find(s);
	if (i != molecules.end())
		return &(i->second);
	return NULL;
}